

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

void __thiscall ON_HatchLine::Dump(ON_HatchLine *this,ON_TextLog *dump)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = this->m_angle_radians;
  dVar4 = dVar3;
  if ((0.0 <= dVar3) && (dVar3 < 6.283185307179586)) {
    dVar4 = (double)(-(ulong)(dVar3 * 57.29577951308232 < 360.0) &
                    (ulong)(dVar3 * 57.29577951308232));
  }
  ON_TextLog::Print(dump,"ON_HatchLine: angle = %lf radians ( %lf degrees) ",dVar3,dVar4);
  ON_TextLog::Print(dump," base = ");
  ON_TextLog::Print(dump,&this->m_base);
  ON_TextLog::Print(dump," offset = ");
  ON_TextLog::Print(dump,&this->m_offset);
  uVar1 = (this->m_dashes).m_count;
  ON_TextLog::Print(dump,"\nDash count = %d: ",(ulong)uVar1);
  if (0 < (long)(int)uVar1) {
    uVar2 = 0;
    do {
      dVar3 = 0.0;
      if ((long)uVar2 < (long)(this->m_dashes).m_count) {
        dVar3 = (this->m_dashes).m_a[uVar2];
      }
      ON_TextLog::Print(dump,"%lf",dVar3);
      if (uVar2 < uVar1 - 1) {
        ON_TextLog::Print(dump,", ");
      }
      uVar2 = uVar2 + 1;
    } while ((long)(int)uVar1 != uVar2);
  }
  ON_TextLog::Print(dump,"\n");
  return;
}

Assistant:

void ON_HatchLine::Dump( ON_TextLog& dump) const
{
  dump.Print( "ON_HatchLine: angle = %lf radians ( %lf degrees) ", 
    AngleRadians(), AngleDegrees());
  dump.Print( " base = ");
  dump.Print( m_base);
  dump.Print( " offset = ");
  dump.Print( m_offset);
  int count = m_dashes.Count();
  dump.Print( "\nDash count = %d: ", count);
  for( int i = 0; i < count; i++)
  {
    dump.Print( "%lf", Dash( i));
    if( i < count-1)
      dump.Print( ", ");
  }
  dump.Print( "\n");
}